

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGCheckCombine(void *payload,void *data,xmlChar *name)

{
  bool bVar1;
  int iVar2;
  xmlChar *str1;
  xmlRelaxNGDefinePtr_conflict payload_00;
  xmlHashTablePtr pxVar3;
  xmlChar local_88 [8];
  char tmpname [32];
  xmlRelaxNGDefinePtr local_60;
  xmlRelaxNGDefinePtr_conflict tmp2;
  xmlRelaxNGDefinePtr_conflict tmp;
  xmlRelaxNGDefinePtr_conflict last;
  xmlRelaxNGDefinePtr_conflict cur;
  int missing;
  int choiceOrInterleave;
  xmlChar *combine;
  xmlRelaxNGParserCtxtPtr ctxt;
  xmlRelaxNGDefinePtr_conflict define;
  xmlChar *name_local;
  void *data_local;
  void *payload_local;
  
  cur._4_4_ = -1;
  bVar1 = false;
  last = (xmlRelaxNGDefinePtr_conflict)payload;
  if (*(long *)((long)payload + 0x58) != 0) {
    for (; last != (xmlRelaxNGDefinePtr_conflict)0x0; last = last->nextHash) {
      str1 = xmlGetProp(last->node,(xmlChar *)"combine");
      if (str1 == (xmlChar *)0x0) {
        if (bVar1) {
          xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x41e,
                     "Some defines for %s needs the combine attribute\n",name,(xmlChar *)0x0);
        }
        else {
          bVar1 = true;
        }
      }
      else {
        iVar2 = xmlStrEqual(str1,(xmlChar *)"choice");
        if (iVar2 == 0) {
          iVar2 = xmlStrEqual(str1,(xmlChar *)"interleave");
          if (iVar2 == 0) {
            xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x45a,
                       "Defines for %s use unknown combine value \'%s\'\'\n",name,str1);
          }
          else if (cur._4_4_ == -1) {
            cur._4_4_ = 0;
          }
          else if (cur._4_4_ == 1) {
            xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x3f2,
                       "Defines for %s use both \'choice\' and \'interleave\'\n",name,(xmlChar *)0x0
                      );
          }
        }
        else if (cur._4_4_ == -1) {
          cur._4_4_ = 1;
        }
        else if (cur._4_4_ == 0) {
          xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x3f2,
                     "Defines for %s use both \'choice\' and \'interleave\'\n",name,(xmlChar *)0x0);
        }
        (*xmlFree)(str1);
      }
    }
    if (cur._4_4_ == -1) {
      cur._4_4_ = 0;
    }
    payload_00 = xmlRelaxNGNewDefine((xmlRelaxNGParserCtxtPtr)data,
                                     *(xmlNodePtr *)((long)payload + 8));
    if (payload_00 != (xmlRelaxNGDefinePtr_conflict)0x0) {
      if (cur._4_4_ == 0) {
        payload_00->type = XML_RELAXNG_INTERLEAVE;
      }
      else {
        payload_00->type = XML_RELAXNG_CHOICE;
      }
      tmp = (xmlRelaxNGDefinePtr_conflict)0x0;
      for (tmp2 = (xmlRelaxNGDefinePtr_conflict)payload; tmp2 != (xmlRelaxNGDefinePtr_conflict)0x0;
          tmp2 = tmp2->nextHash) {
        if (tmp2->content != (xmlRelaxNGDefinePtr)0x0) {
          if (tmp2->content->next == (xmlRelaxNGDefinePtr)0x0) {
            local_60 = tmp2->content;
          }
          else {
            local_60 = xmlRelaxNGNewDefine((xmlRelaxNGParserCtxtPtr)data,tmp2->content->node);
            if (local_60 == (xmlRelaxNGDefinePtr_conflict)0x0) break;
            local_60->type = XML_RELAXNG_GROUP;
            local_60->content = tmp2->content;
          }
          if (tmp == (xmlRelaxNGDefinePtr_conflict)0x0) {
            payload_00->content = local_60;
          }
          else {
            tmp->next = local_60;
          }
          tmp = local_60;
        }
        tmp2->content = payload_00;
      }
      *(xmlRelaxNGDefinePtr_conflict *)((long)payload + 0x30) = payload_00;
      if (cur._4_4_ == 0) {
        if (*(long *)((long)data + 0x68) == 0) {
          pxVar3 = xmlHashCreate(10);
          *(xmlHashTablePtr *)((long)data + 0x68) = pxVar3;
        }
        if (*(long *)((long)data + 0x68) == 0) {
          xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x416,
                     "Failed to create interleaves hash table\n",(xmlChar *)0x0,(xmlChar *)0x0);
        }
        else {
          *(int *)((long)data + 0x60) = *(int *)((long)data + 0x60) + 1;
          snprintf((char *)local_88,0x20,"interleave%d");
          iVar2 = xmlHashAddEntry(*(xmlHashTablePtr *)((long)data + 0x68),local_88,payload_00);
          if (iVar2 < 0) {
            xmlRngPErr((xmlRelaxNGParserCtxtPtr)data,*(xmlNodePtr *)((long)payload + 8),0x416,
                       "Failed to add %s to hash table\n",local_88,(xmlChar *)0x0);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void
xmlRelaxNGCheckCombine(void *payload, void *data, const xmlChar * name)
{
    xmlRelaxNGDefinePtr define = (xmlRelaxNGDefinePtr) payload;
    xmlRelaxNGParserCtxtPtr ctxt = (xmlRelaxNGParserCtxtPtr) data;
    xmlChar *combine;
    int choiceOrInterleave = -1;
    int missing = 0;
    xmlRelaxNGDefinePtr cur, last, tmp, tmp2;

    if (define->nextHash == NULL)
        return;
    cur = define;
    while (cur != NULL) {
        combine = xmlGetProp(cur->node, BAD_CAST "combine");
        if (combine != NULL) {
            if (xmlStrEqual(combine, BAD_CAST "choice")) {
                if (choiceOrInterleave == -1)
                    choiceOrInterleave = 1;
                else if (choiceOrInterleave == 0) {
                    xmlRngPErr(ctxt, define->node, XML_RNGP_DEF_CHOICE_AND_INTERLEAVE,
                               "Defines for %s use both 'choice' and 'interleave'\n",
                               name, NULL);
                }
            } else if (xmlStrEqual(combine, BAD_CAST "interleave")) {
                if (choiceOrInterleave == -1)
                    choiceOrInterleave = 0;
                else if (choiceOrInterleave == 1) {
                    xmlRngPErr(ctxt, define->node, XML_RNGP_DEF_CHOICE_AND_INTERLEAVE,
                               "Defines for %s use both 'choice' and 'interleave'\n",
                               name, NULL);
                }
            } else {
                xmlRngPErr(ctxt, define->node, XML_RNGP_UNKNOWN_COMBINE,
                           "Defines for %s use unknown combine value '%s''\n",
                           name, combine);
            }
            xmlFree(combine);
        } else {
            if (missing == 0)
                missing = 1;
            else {
                xmlRngPErr(ctxt, define->node, XML_RNGP_NEED_COMBINE,
                           "Some defines for %s needs the combine attribute\n",
                           name, NULL);
            }
        }

        cur = cur->nextHash;
    }
    if (choiceOrInterleave == -1)
        choiceOrInterleave = 0;
    cur = xmlRelaxNGNewDefine(ctxt, define->node);
    if (cur == NULL)
        return;
    if (choiceOrInterleave == 0)
        cur->type = XML_RELAXNG_INTERLEAVE;
    else
        cur->type = XML_RELAXNG_CHOICE;
    tmp = define;
    last = NULL;
    while (tmp != NULL) {
        if (tmp->content != NULL) {
            if (tmp->content->next != NULL) {
                /*
                 * we need first to create a wrapper.
                 */
                tmp2 = xmlRelaxNGNewDefine(ctxt, tmp->content->node);
                if (tmp2 == NULL)
                    break;
                tmp2->type = XML_RELAXNG_GROUP;
                tmp2->content = tmp->content;
            } else {
                tmp2 = tmp->content;
            }
            if (last == NULL) {
                cur->content = tmp2;
            } else {
                last->next = tmp2;
            }
            last = tmp2;
        }
        tmp->content = cur;
        tmp = tmp->nextHash;
    }
    define->content = cur;
    if (choiceOrInterleave == 0) {
        if (ctxt->interleaves == NULL)
            ctxt->interleaves = xmlHashCreate(10);
        if (ctxt->interleaves == NULL) {
            xmlRngPErr(ctxt, define->node, XML_RNGP_INTERLEAVE_CREATE_FAILED,
                       "Failed to create interleaves hash table\n", NULL,
                       NULL);
        } else {
            char tmpname[32];

            snprintf(tmpname, 32, "interleave%d", ctxt->nbInterleaves++);
            if (xmlHashAddEntry(ctxt->interleaves, BAD_CAST tmpname, cur) <
                0) {
                xmlRngPErr(ctxt, define->node, XML_RNGP_INTERLEAVE_CREATE_FAILED,
                           "Failed to add %s to hash table\n",
			   (const xmlChar *) tmpname, NULL);
            }
        }
    }
}